

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastexp_test.cpp
# Opt level: O0

void __thiscall FASTEXP_ZeroZero_Test::TestBody(FASTEXP_ZeroZero_Test *this)

{
  bool bVar1;
  ll lhs;
  char *message;
  AssertHelper local_40;
  Message local_38 [3];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  FASTEXP_ZeroZero_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  lhs = fastexp(0,0,0xb7e77cf);
  testing::internal::EqHelper<false>::Compare
            ((EqHelper<false> *)local_20,"fastexp(0, 0, 192837583)","((ll) 1)",lhs,1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_38);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/number-theory/fastexp_test.cpp"
               ,0xe,message);
    testing::internal::AssertHelper::operator=(&local_40,local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::Message::~Message(local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(FASTEXP, ZeroZero) {
	EXPECT_EQ(fastexp(0, 0, 192837583), ((ll) 1));
}